

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json.cpp
# Opt level: O3

char * __thiscall argo::json::get_instance_type_name(json *this)

{
  if ((ulong)this->m_type < 7) {
    return *(char **)(&DAT_001288c8 + (ulong)this->m_type * 8);
  }
  return "corrupted";
}

Assistant:

const char *json::get_instance_type_name() const
{
    switch (m_type)
    {
    case object_e:
        return "object";
    case array_e:
        return "array";
    case boolean_e:
        return "boolean";
    case null_e:
        return "null";
    case number_int_e:
        return "number (int)";
    case number_double_e:
        return "number (double)";
    case string_e:
        return "string";
    default:
        return "corrupted";
    }
}